

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O3

line_type MSH::hash_line_type(string *inString)

{
  int iVar1;
  line_type lVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)inString);
  if (iVar1 == 0) {
    lVar2 = eMeshFormat;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)inString);
    if (iVar1 == 0) {
      lVar2 = ePhysicalNames;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)inString);
      if (iVar1 == 0) {
        lVar2 = eNodes;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)inString);
        lVar2 = (uint)(iVar1 == 0) * 3;
      }
    }
  }
  return lVar2;
}

Assistant:

MSH::line_type MSH::hash_line_type(std::string const& inString)
{
    if(inString == "$MeshFormat") return eMeshFormat;
    if(inString == "$PhysicalNames") return ePhysicalNames;
    if(inString == "$Nodes") return eNodes;
    if(inString == "$Elements") return eElements;
    return eDefault;
}